

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

tcache_t * tcache_create_explicit(tsd_t *tsd)

{
  long *plVar1;
  rtree_ctx_cache_elm_t *prVar2;
  undefined8 *puVar3;
  void *pvVar4;
  arena_t *paVar5;
  rtree_leaf_elm_t *prVar6;
  long lVar7;
  tsd_t *tsd_00;
  rtree_leaf_elm_t *prVar8;
  atomic_p_t aVar9;
  ulong uVar10;
  rtree_leaf_elm_t *extraout_RDX;
  rtree_leaf_elm_t *extraout_RDX_00;
  rtree_leaf_elm_t *extraout_RDX_01;
  ulong uVar11;
  rtree_leaf_elm_t *extraout_RDX_02;
  rtree_leaf_elm_t *avail_stack;
  rtree_leaf_elm_t *extraout_RDX_03;
  rtree_ctx_cache_elm_t *prVar12;
  rtree_ctx_cache_elm_t *prVar13;
  uint uVar14;
  rtree_ctx_t *prVar15;
  rtree_leaf_elm_t *prVar16;
  size_t usize;
  bool bVar17;
  rtree_ctx_t local_1b0;
  
  if ((ulong)stack_nelms < 0x438) {
    uVar14 = stack_nelms * 8 + 0x1687 & 0x7fc0;
    if (uVar14 < 0x1001) {
      usize = sz_index2size_tab[sz_size2index_tab[uVar14 >> 3]];
    }
    else {
      uVar10 = (ulong)uVar14 * 2 - 1;
      lVar7 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      uVar10 = ~(-1L << ((char)lVar7 - 3U & 0x3f));
      if ((uint)lVar7 < 7) {
        uVar10 = 0xf;
      }
      usize = ~uVar10 & uVar10 + uVar14;
    }
    if (0x3fff < usize) goto LAB_001161af;
  }
  else {
LAB_001161af:
    uVar10 = 0x4000;
    if (0x537 < stack_nelms) {
      uVar11 = (ulong)stack_nelms * 8 + 0x1648;
      uVar10 = uVar11 * 2 - 1;
      lVar7 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      uVar10 = ~(-1L << ((char)lVar7 - 3U & 0x3f));
      if ((uint)lVar7 < 7) {
        uVar10 = 0xf;
      }
      uVar10 = ~uVar10 & uVar10 + uVar11;
      if (uVar10 < uVar11) {
        usize = 0;
        goto LAB_00116207;
      }
    }
    usize = 0;
    if (uVar10 < 0xfffffffffffff000) {
      usize = uVar10;
    }
  }
LAB_00116207:
  aVar9.repr = arenas[0].repr;
  if (arenas[0].repr == (void *)0x0) {
    aVar9.repr = arena_init((tsdn_t *)0x0,0,&extent_hooks_default);
  }
  tsd_00 = (tsd_t *)arena_palloc((tsdn_t *)tsd,(arena_t *)aVar9.repr,usize,0x40,true,(tcache_t *)0x0
                                );
  if (tsd_00 == (tsd_t *)0x0) {
    return (tcache_t *)0x0;
  }
  if (tsd == (tsd_t *)0x0) {
    prVar15 = &local_1b0;
    rtree_ctx_data_init(prVar15);
    avail_stack = extraout_RDX_00;
  }
  else {
    prVar15 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    avail_stack = extraout_RDX;
  }
  uVar14 = (uint)((ulong)tsd_00 >> 0x1e) & 0xf;
  prVar16 = (rtree_leaf_elm_t *)((ulong)tsd_00 & 0xffffffffc0000000);
  uVar10 = (ulong)(uVar14 << 4);
  puVar3 = (undefined8 *)((long)&prVar15->cache[0].leafkey + uVar10);
  prVar8 = *(rtree_leaf_elm_t **)((long)&prVar15->cache[0].leafkey + uVar10);
  if (prVar8 == prVar16) {
    prVar8 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)tsd_00 >> 9) & 0x1ffff8) + puVar3[1]);
  }
  else if ((rtree_leaf_elm_t *)prVar15->l2_cache[0].leafkey == prVar16) {
    avail_stack = prVar15->l2_cache[0].leaf;
    prVar15->l2_cache[0].leafkey = (uintptr_t)prVar8;
    prVar15->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
    *puVar3 = prVar16;
    puVar3[1] = avail_stack;
    prVar8 = (rtree_leaf_elm_t *)
             ((long)&(avail_stack->le_bits).repr + (ulong)((uint)((ulong)tsd_00 >> 9) & 0x1ffff8));
  }
  else {
    prVar12 = prVar15->l2_cache + 1;
    if ((rtree_leaf_elm_t *)prVar15->l2_cache[1].leafkey == prVar16) {
      uVar11 = 0;
      bVar17 = false;
    }
    else {
      uVar10 = 1;
      prVar13 = prVar12;
      do {
        uVar11 = uVar10;
        bVar17 = 6 < uVar11;
        if (uVar11 == 7) {
          avail_stack = (rtree_leaf_elm_t *)0x7;
          goto LAB_00116523;
        }
        prVar12 = prVar13 + 1;
        prVar2 = prVar13 + 1;
        uVar10 = uVar11 + 1;
        prVar13 = prVar12;
      } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar16);
      bVar17 = 6 < uVar11;
    }
    prVar6 = prVar12->leaf;
    avail_stack = (rtree_leaf_elm_t *)(uVar11 * 0x10);
    prVar12->leafkey = prVar15->l2_cache[uVar11].leafkey;
    prVar12->leaf = prVar15->l2_cache[uVar11].leaf;
    prVar15->l2_cache[uVar11].leafkey = (uintptr_t)prVar8;
    prVar15->l2_cache[uVar11].leaf = (rtree_leaf_elm_t *)puVar3[1];
    *puVar3 = prVar16;
    puVar3[1] = prVar6;
    prVar8 = (rtree_leaf_elm_t *)
             ((long)&(prVar6->le_bits).repr + (ulong)((uint)((ulong)tsd_00 >> 9) & 0x1ffff8));
LAB_00116523:
    if (bVar17) {
      prVar8 = rtree_leaf_elm_lookup_hard
                         ((tsdn_t *)tsd,&extents_rtree,prVar15,(uintptr_t)tsd_00,true,false);
      avail_stack = extraout_RDX_02;
    }
  }
  pvVar4 = arenas[*(uint *)(((long)(prVar8->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe) &
                  0xfff].repr;
  if (tsd == (tsd_t *)0x0) {
    prVar15 = &local_1b0;
    rtree_ctx_data_init(prVar15);
    avail_stack = extraout_RDX_01;
  }
  else {
    prVar15 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar10 = (ulong)(uVar14 << 4);
  puVar3 = (undefined8 *)((long)&prVar15->cache[0].leafkey + uVar10);
  prVar8 = *(rtree_leaf_elm_t **)((long)&prVar15->cache[0].leafkey + uVar10);
  if (prVar8 == prVar16) {
    prVar8 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)tsd_00 >> 9) & 0x1ffff8) + puVar3[1]);
  }
  else if ((rtree_leaf_elm_t *)prVar15->l2_cache[0].leafkey == prVar16) {
    avail_stack = prVar15->l2_cache[0].leaf;
    prVar15->l2_cache[0].leafkey = (uintptr_t)prVar8;
    prVar15->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
    *puVar3 = prVar16;
    puVar3[1] = avail_stack;
    prVar8 = (rtree_leaf_elm_t *)
             ((long)&(avail_stack->le_bits).repr + (ulong)((uint)((ulong)tsd_00 >> 9) & 0x1ffff8));
  }
  else {
    prVar12 = prVar15->l2_cache + 1;
    if ((rtree_leaf_elm_t *)prVar15->l2_cache[1].leafkey == prVar16) {
      uVar11 = 0;
      bVar17 = false;
    }
    else {
      uVar10 = 1;
      prVar13 = prVar12;
      do {
        uVar11 = uVar10;
        bVar17 = 6 < uVar11;
        if (uVar11 == 7) {
          avail_stack = (rtree_leaf_elm_t *)0x7;
          goto LAB_001165ac;
        }
        prVar12 = prVar13 + 1;
        prVar2 = prVar13 + 1;
        uVar10 = uVar11 + 1;
        prVar13 = prVar12;
      } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar16);
      bVar17 = 6 < uVar11;
    }
    prVar6 = prVar12->leaf;
    avail_stack = (rtree_leaf_elm_t *)(uVar11 * 0x10);
    prVar12->leafkey = prVar15->l2_cache[uVar11].leafkey;
    prVar12->leaf = prVar15->l2_cache[uVar11].leaf;
    prVar15->l2_cache[uVar11].leafkey = (uintptr_t)prVar8;
    prVar15->l2_cache[uVar11].leaf = (rtree_leaf_elm_t *)puVar3[1];
    *puVar3 = prVar16;
    puVar3[1] = prVar6;
    prVar8 = (rtree_leaf_elm_t *)
             ((long)&(prVar6->le_bits).repr + (ulong)((uint)((ulong)tsd_00 >> 9) & 0x1ffff8));
LAB_001165ac:
    if (bVar17) {
      prVar8 = rtree_leaf_elm_lookup_hard
                         ((tsdn_t *)tsd,&extents_rtree,prVar15,(uintptr_t)tsd_00,true,false);
      avail_stack = extraout_RDX_03;
    }
  }
  LOCK();
  plVar1 = (long *)((long)pvVar4 + 0x68);
  *plVar1 = *plVar1 + sz_index2size_tab[(ulong)(prVar8->le_bits).repr >> 0x30];
  UNLOCK();
  if (tsd_00 == (tsd_t *)0x0) {
    return (tcache_t *)0x0;
  }
  tcache_init(tsd_00,(tcache_t *)
                     &(tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).
                      bins_large[0xaf].tstats,avail_stack);
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
    aVar9.repr = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena;
    if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena == (arena_t *)0x0) &&
       (aVar9.repr = arena_choose_hard(tsd,true),
       tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true)) {
      paVar5 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).arena;
      if (paVar5 != (arena_t *)0x0) {
        if (paVar5 == (arena_t *)aVar9.repr) goto LAB_00116323;
        tcache_arena_dissociate
                  ((tsdn_t *)tsd,&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache)
        ;
      }
      tcache_arena_associate
                ((tsdn_t *)tsd,&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                 (arena_t *)aVar9.repr);
    }
  }
  else {
    aVar9 = arenas[0];
    if (arenas[0].repr == (void *)0x0) {
      aVar9.repr = arena_init((tsdn_t *)tsd,0,&extent_hooks_default);
    }
  }
LAB_00116323:
  tcache_arena_associate((tsdn_t *)tsd,(tcache_t *)tsd_00,(arena_t *)aVar9.repr);
  return (tcache_t *)tsd_00;
}

Assistant:

tcache_t *
tcache_create_explicit(tsd_t *tsd) {
	tcache_t *tcache;
	size_t size, stack_offset;

	size = sizeof(tcache_t);
	/* Naturally align the pointer stacks. */
	size = PTR_CEILING(size);
	stack_offset = size;
	size += stack_nelms * sizeof(void *);
	/* Avoid false cacheline sharing. */
	size = sz_sa2u(size, CACHELINE);

	tcache = ipallocztm(tsd_tsdn(tsd), size, CACHELINE, true, NULL, true,
	    arena_get(TSDN_NULL, 0, true));
	if (tcache == NULL) {
		return NULL;
	}

	tcache_init(tsd, tcache,
	    (void *)((uintptr_t)tcache + (uintptr_t)stack_offset));
	tcache_arena_associate(tsd_tsdn(tsd), tcache, arena_ichoose(tsd, NULL));

	return tcache;
}